

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O2

int evmap_signal_foreach_signal(event_base *base,evmap_signal_foreach_signal_cb fn,void *arg)

{
  evmap_signal *peVar1;
  int iVar2;
  long lVar3;
  
  lVar3 = 0;
  while ((iVar2 = 0, lVar3 < (base->sigmap).nentries &&
         ((peVar1 = (evmap_signal *)(base->sigmap).entries[lVar3], peVar1 == (evmap_signal *)0x0 ||
          (iVar2 = (*fn)(base,(int)lVar3,peVar1,arg), iVar2 == 0))))) {
    lVar3 = lVar3 + 1;
  }
  return iVar2;
}

Assistant:

static int
evmap_signal_foreach_signal(struct event_base *base,
    evmap_signal_foreach_signal_cb fn,
    void *arg)
{
	struct event_signal_map *sigmap = &base->sigmap;
	int r = 0;
	int signum;

	for (signum = 0; signum < sigmap->nentries; ++signum) {
		struct evmap_signal *ctx = sigmap->entries[signum];
		if (!ctx)
			continue;
		if ((r = fn(base, signum, ctx, arg)))
			break;
	}
	return r;
}